

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void AdjustSpriteOffsets(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  FTextureID FVar5;
  int iVar6;
  int iVar7;
  FTexture *this;
  char name [30];
  FScanner sc;
  char local_158 [40];
  FScanner local_130;
  
  if (AdjustSpriteOffsets()::done == '\0') {
    AdjustSpriteOffsets()::done = '\x01';
    mysnprintf(local_158,0x1e,"sprofs/%s.sprofs");
    iVar4 = FWadCollection::CheckNumForFullName(&Wads,local_158,false,0);
    if (-1 < iVar4) {
      FScanner::FScanner(&local_130);
      FScanner::OpenLumpNum(&local_130,iVar4);
      FGLRenderer::FlushTextures(GLRenderer);
      iVar4 = FWadCollection::GetLumpFile(&Wads,iVar4);
      while( true ) {
        bVar3 = FScanner::GetString(&local_130);
        if (!bVar3) break;
        FVar5 = FTextureManager::CheckForTexture(&TexMan,local_130.String,3,1);
        FScanner::GetNumber(&local_130);
        iVar1 = local_130.Number;
        FScanner::GetNumber(&local_130);
        iVar2 = local_130.Number;
        if (0 < FVar5.texnum) {
          if ((uint)FVar5.texnum < TexMan.Textures.Count) {
            this = TexMan.Textures.Array[(uint)FVar5.texnum].Texture;
          }
          else {
            this = (FTexture *)0x0;
          }
          iVar6 = (*this->_vptr_FTexture[6])(this);
          if (-1 < iVar6) {
            iVar7 = FWadCollection::GetNumLumps(&Wads);
            if (iVar6 < iVar7) {
              iVar6 = FWadCollection::GetLumpFile(&Wads,iVar6);
              if ((iVar6 == 1) || (iVar6 == iVar4)) {
                this->LeftOffset = (SWORD)iVar1;
                this->TopOffset = (SWORD)iVar2;
                FTexture::KillNative(this);
              }
            }
          }
        }
      }
      FScanner::~FScanner(&local_130);
    }
  }
  return;
}

Assistant:

void AdjustSpriteOffsets()
{
	static bool done=false;
	char name[30];

	if (done) return;
	done=true;

	mysnprintf(name, countof(name), "sprofs/%s.sprofs", GameNames[gameinfo.gametype]);
	int lump = Wads.CheckNumForFullName(name);
	if (lump>=0)
	{
		FScanner sc;
		sc.OpenLumpNum(lump);
		GLRenderer->FlushTextures();
		int ofslumpno = Wads.GetLumpFile(lump);
		while (sc.GetString())
		{
			int x,y;
			FTextureID texno = TexMan.CheckForTexture(sc.String, FTexture::TEX_Sprite);
			sc.GetNumber();
			x=sc.Number;
			sc.GetNumber();
			y=sc.Number;

			if (texno.isValid())
			{
				FTexture * tex = TexMan[texno];

				int lumpnum = tex->GetSourceLump();
				// We only want to change texture offsets for sprites in the IWAD or the file this lump originated from.
				if (lumpnum >= 0 && lumpnum < Wads.GetNumLumps())
				{
					int wadno = Wads.GetLumpFile(lumpnum);
					if (wadno==FWadCollection::IWAD_FILENUM || wadno == ofslumpno)
					{
						tex->LeftOffset=x;
						tex->TopOffset=y;
						tex->KillNative();
					}
				}
			}
		}
	}
}